

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_path_unittest.cc
# Opt level: O2

void __thiscall GetUniquePathTest_PMIx_Test::TestBody(GetUniquePathTest_PMIx_Test *this)

{
  char *pcVar1;
  undefined1 local_148 [8];
  WithEnv rank;
  WithEnv withTestVar;
  char *expectedParent;
  string expectedChild;
  WithEnv withForced;
  AssertionResult gtest_ar_2;
  allocator<char> local_39;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  AssertHelper local_18;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(rank.val.field_2._M_local_buf + 8),"PMIX_RANK",
             (allocator<char> *)&expectedParent);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(expectedChild.field_2._M_local_buf + 8),"5",(allocator<char> *)local_38);
  WithEnv::WithEnv((WithEnv *)local_148,(string *)((long)&rank.val.field_2 + 8),
                   (string *)((long)&expectedChild.field_2 + 8));
  std::__cxx11::string::~string((string *)(expectedChild.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(rank.val.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(expectedChild.field_2._M_local_buf + 8),"GPROF_TEST_PATH",
             (allocator<char> *)local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expectedParent,"/var/log/some_file_name",
             (allocator<char> *)(withForced.val.field_2._M_local_buf + 8));
  WithEnv::WithEnv((WithEnv *)((long)&rank.val.field_2 + 8),
                   (string *)((long)&expectedChild.field_2 + 8),(string *)&expectedParent);
  std::__cxx11::string::~string((string *)&expectedParent);
  std::__cxx11::string::~string((string *)(expectedChild.field_2._M_local_buf + 8));
  withTestVar.val.field_2._8_8_ = anon_var_dwarf_44c5;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(expectedChild.field_2._M_local_buf + 8),"/var/log/some_file_name.rank-5",
             (allocator<char> *)local_38);
  AppendPID((string *)&expectedParent,(string *)((long)&expectedChild.field_2 + 8));
  std::__cxx11::string::~string((string *)(expectedChild.field_2._M_local_buf + 8));
  GetTestPath_abi_cxx11_();
  testing::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
            ((internal *)local_38,"expectedParent","GetTestPath()",
             (char **)((long)&withTestVar.val.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&expectedChild.field_2 + 8));
  std::__cxx11::string::~string((string *)(expectedChild.field_2._M_local_buf + 8));
  if (local_38[0] == (allocator<char>)0x0) {
    testing::Message::Message((Message *)((long)&expectedChild.field_2 + 8));
    if (gtest_ar._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&withForced.val.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/unique_path_unittest.cc"
               ,0x6f,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&withForced.val.field_2 + 8),
               (Message *)((long)&expectedChild.field_2 + 8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)((long)&withForced.val.field_2 + 8));
    if (expectedChild.field_2._8_8_ != 0) {
      (**(code **)(*(long *)expectedChild.field_2._8_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  GetTestPath_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)local_38,"expectedChild","GetTestPath()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&expectedParent,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&expectedChild.field_2 + 8));
  std::__cxx11::string::~string((string *)(expectedChild.field_2._M_local_buf + 8));
  if (local_38[0] == (allocator<char>)0x0) {
    testing::Message::Message((Message *)((long)&expectedChild.field_2 + 8));
    if (gtest_ar._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&withForced.val.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/unique_path_unittest.cc"
               ,0x72,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&withForced.val.field_2 + 8),
               (Message *)((long)&expectedChild.field_2 + 8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)((long)&withForced.val.field_2 + 8));
    if (expectedChild.field_2._8_8_ != 0) {
      (**(code **)(*(long *)expectedChild.field_2._8_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  WithEnv::Reset((WithEnv *)((long)&rank.val.field_2 + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,"GPROF_TEST_PATH_USE_PID",(allocator<char> *)&local_18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(withForced.val.field_2._M_local_buf + 8),"1",&local_39);
  WithEnv::WithEnv((WithEnv *)((long)&expectedChild.field_2 + 8),(string *)local_38,
                   (string *)((long)&withForced.val.field_2 + 8));
  std::__cxx11::string::~string((string *)(withForced.val.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_38);
  GetTestPath_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)(withForced.val.field_2._M_local_buf + 8),"expectedChild","GetTestPath()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&expectedParent,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  if (withForced.val.field_2._M_local_buf[8] == '\0') {
    testing::Message::Message((Message *)local_38);
    if (gtest_ar_2._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar_2._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/unique_path_unittest.cc"
               ,0x78,pcVar1);
    testing::internal::AssertHelper::operator=(&local_18,(Message *)local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_18);
    if ((long *)CONCAT71(local_38._1_7_,local_38[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_38._1_7_,local_38[0]) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_2);
  GetTestPath_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)(withForced.val.field_2._M_local_buf + 8),"expectedChild","GetTestPath()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&expectedParent,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  if (withForced.val.field_2._M_local_buf[8] == '\0') {
    testing::Message::Message((Message *)local_38);
    if (gtest_ar_2._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar_2._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/unique_path_unittest.cc"
               ,0x7b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_18,(Message *)local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_18);
    if ((long *)CONCAT71(local_38._1_7_,local_38[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_38._1_7_,local_38[0]) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_2);
  WithEnv::~WithEnv((WithEnv *)((long)&expectedChild.field_2 + 8));
  std::__cxx11::string::~string((string *)&expectedParent);
  WithEnv::~WithEnv((WithEnv *)((long)&rank.val.field_2 + 8));
  WithEnv::~WithEnv((WithEnv *)local_148);
  return;
}

Assistant:

TEST(GetUniquePathTest, PMIx) {
  WithEnv rank("PMIX_RANK", "5");
  WithEnv withTestVar(TEST_VAR, TEST_VAL);

  const auto expectedParent = TEST_VAL ".rank-5";
  const auto expectedChild = AppendPID(expectedParent);

  // Test parent case (will set the child flag)
  EXPECT_EQ(expectedParent, GetTestPath());

  // Test child case
  EXPECT_EQ(expectedChild, GetTestPath());

  withTestVar.Reset();
  WithEnv withForced(TEST_VAR "_USE_PID", "1");

  // Test parent case (will set the child flag)
  EXPECT_EQ(expectedChild, GetTestPath());

  // Test child case
  EXPECT_EQ(expectedChild, GetTestPath());
}